

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O1

uint64_t quicly_decodev(uint8_t **src,uint8_t *end)

{
  ulong uVar1;
  byte *pbVar2;
  ulong uVar3;
  long lVar4;
  
  pbVar2 = *src;
  uVar1 = 0xffffffffffffffff;
  if (pbVar2 != end) {
    if (*pbVar2 < 0x40) {
      *src = pbVar2 + 1;
      return (ulong)*pbVar2;
    }
    uVar3 = 1L << (*pbVar2 >> 6);
    if (uVar3 <= (ulong)((long)end - (long)pbVar2) && -1 < (long)end - (long)pbVar2) {
      *src = pbVar2 + 1;
      uVar1 = (ulong)(*pbVar2 & 0x3f);
      lVar4 = uVar3 - 1;
      pbVar2 = pbVar2 + 2;
      do {
        *src = pbVar2;
        uVar1 = uVar1 << 8 | (ulong)pbVar2[-1];
        pbVar2 = pbVar2 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  return uVar1;
}

Assistant:

inline uint64_t quicly_decodev(const uint8_t **src, const uint8_t *end)
{
    if (*src == end)
        return UINT64_MAX;
    if (**src >> 6 == 0)
        return *(*src)++;

    /* multi-byte */
    size_t len = 1 << (**src >> 6);
    if (end - *src < 0 || (size_t)(end - *src) < len)
        return UINT64_MAX;
    uint64_t v = *(*src)++ & 0x3f;
    --len;
    do {
        v = (v << 8) | *(*src)++;
    } while (--len != 0);
    return v;
}